

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O1

void __thiscall Imf_3_4::MultiPartInputFile::flushPartCache(MultiPartInputFile *this)

{
  pthread_mutex_t *__mutex;
  element_type *peVar1;
  pointer pPVar2;
  int iVar3;
  any *paVar4;
  pointer pPVar5;
  
  __mutex = (pthread_mutex_t *)
            (this->_data).
            super___shared_ptr<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 == 0) {
    peVar1 = (this->_data).
             super___shared_ptr<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pPVar5 = (peVar1->parts).
             super__Vector_base<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar2 = (peVar1->parts).
             super__Vector_base<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pPVar5 != pPVar2) {
      paVar4 = &pPVar5->file;
      do {
        if (paVar4->_M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
          (*paVar4->_M_manager)(_Op_destroy,paVar4,(_Arg *)0x0);
          paVar4->_M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        }
        pPVar5 = (pointer)(paVar4 + 1);
        paVar4 = paVar4 + 6;
      } while (pPVar5 != pPVar2);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void
MultiPartInputFile::flushPartCache ()
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    for (auto &part: _data->parts)
        part.file.reset();
}